

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_deblk_edge_filter.c
# Opt level: O0

void ihevc_deblk_chroma_vert
               (UWORD8 *pu1_src,WORD32 src_strd,WORD32 quant_param_p,WORD32 quant_param_q,
               WORD32 qp_offset_u,WORD32 qp_offset_v,WORD32 tc_offset_div2,WORD32 filter_flag_p,
               WORD32 filter_flag_q)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  byte *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  WORD32 row;
  WORD32 tmp_q0_v;
  WORD32 tmp_p0_v;
  WORD32 delta_v;
  WORD32 tmp_q0_u;
  WORD32 tmp_p0_u;
  WORD32 delta_u;
  WORD32 tc_v;
  WORD32 tc_indx_v;
  WORD32 tc_u;
  WORD32 tc_indx_u;
  WORD32 qp_chroma_v;
  WORD32 qp_indx_v;
  WORD32 qp_chroma_u;
  WORD32 qp_indx_u;
  byte local_a8;
  byte local_a4;
  byte local_a0;
  byte local_9c;
  int local_98;
  int local_94;
  byte local_90;
  byte local_8c;
  byte local_88;
  byte local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  WORD32 local_68;
  WORD32 local_64;
  WORD32 local_60;
  WORD32 local_5c;
  int local_58;
  byte *local_8;
  
  if ((in_stack_00000010 == 0) && (in_stack_00000018 == 0)) {
    __assert_fail("(filter_flag_p || filter_flag_q)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_deblk_edge_filter.c"
                  ,0x263,
                  "void ihevc_deblk_chroma_vert(UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  local_5c = in_R8D + (in_EDX + in_ECX + 1 >> 1);
  if (-1 < local_5c) {
    if (local_5c < 0x3a) {
      local_60 = gai4_ihevc_qp_table[local_5c];
    }
    else {
      local_60 = local_5c + -6;
    }
    local_5c = local_60;
  }
  local_64 = in_R9D + (in_EDX + in_ECX + 1 >> 1);
  if (-1 < local_64) {
    if (local_64 < 0x3a) {
      local_68 = gai4_ihevc_qp_table[local_64];
    }
    else {
      local_68 = local_64 + -6;
    }
    local_64 = local_68;
  }
  if (local_5c + 2 + in_stack_00000008 * 2 < 0x36) {
    if (local_5c + 2 + in_stack_00000008 * 2 < 0) {
      local_70 = 0;
    }
    else {
      local_70 = local_5c + 2 + in_stack_00000008 * 2;
    }
    local_6c = local_70;
  }
  else {
    local_6c = 0x35;
  }
  iVar1 = gai4_ihevc_tc_table[local_6c];
  if (local_64 + 2 + in_stack_00000008 * 2 < 0x36) {
    if (local_64 + 2 + in_stack_00000008 * 2 < 0) {
      local_78 = 0;
    }
    else {
      local_78 = local_64 + 2 + in_stack_00000008 * 2;
    }
    local_74 = local_78;
  }
  else {
    local_74 = 0x35;
  }
  iVar2 = gai4_ihevc_tc_table[local_74];
  if ((iVar1 != 0) || (iVar2 != 0)) {
    local_8 = in_RDI;
    for (local_58 = 0; local_58 < 4; local_58 = local_58 + 1) {
      local_7c = iVar1;
      if ((int)(((((uint)*local_8 - (uint)local_8[-2]) * 4 + (uint)local_8[-4]) - (uint)local_8[2])
               + 4) >> 3 <= iVar1) {
        iVar3 = (int)(((((uint)*local_8 - (uint)local_8[-2]) * 4 + (uint)local_8[-4]) -
                      (uint)local_8[2]) + 4) >> 3;
        if (SBORROW4(iVar3,-iVar1) == iVar3 + iVar1 < 0) {
          local_80 = (int)(((((uint)*local_8 - (uint)local_8[-2]) * 4 + (uint)local_8[-4]) -
                           (uint)local_8[2]) + 4) >> 3;
        }
        else {
          local_80 = -iVar1;
        }
        local_7c = local_80;
      }
      if ((int)((uint)local_8[-2] + local_7c) < 0x100) {
        if ((int)((uint)local_8[-2] + local_7c) < 0) {
          local_88 = 0;
        }
        else {
          local_88 = local_8[-2] + (char)local_7c;
        }
        local_84 = local_88;
      }
      else {
        local_84 = 0xff;
      }
      if ((int)((uint)*local_8 - local_7c) < 0x100) {
        if ((int)((uint)*local_8 - local_7c) < 0) {
          local_90 = 0;
        }
        else {
          local_90 = *local_8 - (char)local_7c;
        }
        local_8c = local_90;
      }
      else {
        local_8c = 0xff;
      }
      local_94 = iVar2;
      if ((int)(((((uint)local_8[1] - (uint)local_8[-1]) * 4 + (uint)local_8[-3]) - (uint)local_8[3]
                ) + 4) >> 3 <= iVar2) {
        iVar3 = (int)(((((uint)local_8[1] - (uint)local_8[-1]) * 4 + (uint)local_8[-3]) -
                      (uint)local_8[3]) + 4) >> 3;
        if (SBORROW4(iVar3,-iVar2) == iVar3 + iVar2 < 0) {
          local_98 = (int)(((((uint)local_8[1] - (uint)local_8[-1]) * 4 + (uint)local_8[-3]) -
                           (uint)local_8[3]) + 4) >> 3;
        }
        else {
          local_98 = -iVar2;
        }
        local_94 = local_98;
      }
      if ((int)((uint)local_8[-1] + local_94) < 0x100) {
        if ((int)((uint)local_8[-1] + local_94) < 0) {
          local_a0 = 0;
        }
        else {
          local_a0 = local_8[-1] + (char)local_94;
        }
        local_9c = local_a0;
      }
      else {
        local_9c = 0xff;
      }
      if ((int)((uint)local_8[1] - local_94) < 0x100) {
        if ((int)((uint)local_8[1] - local_94) < 0) {
          local_a8 = 0;
        }
        else {
          local_a8 = local_8[1] - (char)local_94;
        }
        local_a4 = local_a8;
      }
      else {
        local_a4 = 0xff;
      }
      if (in_stack_00000010 != 0) {
        local_8[-2] = local_84;
        local_8[-1] = local_9c;
      }
      if (in_stack_00000018 != 0) {
        *local_8 = local_8c;
        local_8[1] = local_a4;
      }
      local_8 = local_8 + in_ESI;
    }
  }
  return;
}

Assistant:

void ihevc_deblk_chroma_vert(UWORD8 *pu1_src,
                             WORD32 src_strd,
                             WORD32 quant_param_p,
                             WORD32 quant_param_q,
                             WORD32 qp_offset_u,
                             WORD32 qp_offset_v,
                             WORD32 tc_offset_div2,
                             WORD32 filter_flag_p,
                             WORD32 filter_flag_q)
{
    WORD32 qp_indx_u, qp_chroma_u;
    WORD32 qp_indx_v, qp_chroma_v;
    WORD32 tc_indx_u, tc_u;
    WORD32 tc_indx_v, tc_v;
    WORD32 delta_u, tmp_p0_u, tmp_q0_u;
    WORD32 delta_v, tmp_p0_v, tmp_q0_v;
    WORD32 row;

    ASSERT(filter_flag_p || filter_flag_q);

    /* chroma processing is done only if BS is 2             */
    /* this function is assumed to be called only if BS is 2 */
    qp_indx_u = qp_offset_u + ((quant_param_p + quant_param_q + 1) >> 1);
    qp_chroma_u = qp_indx_u < 0 ? qp_indx_u : (qp_indx_u > 57 ? qp_indx_u - 6 : gai4_ihevc_qp_table[qp_indx_u]);

    qp_indx_v = qp_offset_v + ((quant_param_p + quant_param_q + 1) >> 1);
    qp_chroma_v = qp_indx_v < 0 ? qp_indx_v : (qp_indx_v > 57 ? qp_indx_v - 6 : gai4_ihevc_qp_table[qp_indx_v]);

    tc_indx_u = CLIP3(qp_chroma_u + 2 + (tc_offset_div2 << 1), 0, 53);
    tc_u = gai4_ihevc_tc_table[tc_indx_u];

    tc_indx_v = CLIP3(qp_chroma_v + 2 + (tc_offset_div2 << 1), 0, 53);
    tc_v = gai4_ihevc_tc_table[tc_indx_v];

    if(0 == tc_u && 0 == tc_v)
    {
        return;
    }

    for(row = 0; row < 4; row++)
    {
        delta_u = CLIP3((((pu1_src[0] - pu1_src[-2]) << 2) +
                        pu1_src[-4] - pu1_src[2] + 4) >> 3,
                        -tc_u, tc_u);

        tmp_p0_u = CLIP_U8(pu1_src[-2] + delta_u);
        tmp_q0_u = CLIP_U8(pu1_src[0] - delta_u);

        delta_v = CLIP3((((pu1_src[1] - pu1_src[-1]) << 2) +
                        pu1_src[-3] - pu1_src[3] + 4) >> 3,
                        -tc_v, tc_v);

        tmp_p0_v = CLIP_U8(pu1_src[-1] + delta_v);
        tmp_q0_v = CLIP_U8(pu1_src[1] - delta_v);

        if(filter_flag_p != 0)
        {
            pu1_src[-2] = tmp_p0_u;
            pu1_src[-1] = tmp_p0_v;
        }

        if(filter_flag_q != 0)
        {
            pu1_src[0] = tmp_q0_u;
            pu1_src[1] = tmp_q0_v;
        }

        pu1_src += src_strd;
    }

}